

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetDowngradedClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  FileDescriptor *pFVar1;
  undefined1 in_CL;
  FileDescriptor *file;
  string local_f0;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  pFVar1 = Descriptor::file(descriptor);
  FileJavaPackage_abi_cxx11_(&local_a0,(java *)pFVar1,file);
  std::operator+(&local_80,&local_a0,".");
  pFVar1 = Descriptor::file(local_20);
  GetDowngradedFileClassName_abi_cxx11_(&local_d0,this,pFVar1);
  std::operator+(&local_60,&local_80,&local_d0);
  std::operator+(&local_40,&local_60,".");
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_f0,(_anonymous_namespace_ *)local_20,(Descriptor *)0x0,(bool)in_CL);
  std::operator+(__return_storage_ptr__,&local_40,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetDowngradedClassName(
    const Descriptor* descriptor) {
  return FileJavaPackage(descriptor->file()) + "." +
         GetDowngradedFileClassName(descriptor->file()) + "." +
         ClassNameWithoutPackage(descriptor, false);
}